

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::remove_mblur(SceneGraph *this,Ref<embree::SceneGraph::Node> *node,bool mblur)

{
  bool bVar1;
  long *plVar2;
  long *plVar3;
  long *plVar4;
  long lVar5;
  Node *pNVar6;
  long *plVar7;
  SceneGraph *pSVar8;
  ulong uVar9;
  long local_80;
  long *local_78;
  long *local_70;
  Node *local_68;
  long *local_60;
  long *local_58;
  Ref<embree::SceneGraph::Node> *local_50;
  Ref<embree::SceneGraph::Node> local_48;
  Ref<embree::SceneGraph::Node> local_40;
  Ref<embree::SceneGraph::Node> local_38;
  
  if (node->ptr == (Node *)0x0) {
    plVar2 = (long *)0x0;
  }
  else {
    plVar2 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&TransformNode::typeinfo);
  }
  if (plVar2 == (long *)0x0) {
    if (node->ptr == (Node *)0x0) {
      plVar3 = (long *)0x0;
    }
    else {
      plVar3 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&MultiTransformNode::typeinfo);
    }
    if (plVar3 == (long *)0x0) {
      if (node->ptr == (Node *)0x0) {
        plVar4 = (long *)0x0;
      }
      else {
        plVar4 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&GroupNode::typeinfo);
      }
      local_78 = plVar3;
      local_68 = (Node *)this;
      if (plVar4 == (long *)0x0) {
        if (node->ptr == (Node *)0x0) {
          pNVar6 = (Node *)0x0;
        }
        else {
          pNVar6 = (Node *)__dynamic_cast(node->ptr,&Node::typeinfo,&TriangleMeshNode::typeinfo);
        }
        local_68 = pNVar6;
        if (pNVar6 == (Node *)0x0) {
          if (node->ptr == (Node *)0x0) {
            local_70 = (long *)0x0;
          }
          else {
            local_70 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&QuadMeshNode::typeinfo);
          }
          plVar3 = local_78;
          if (local_70 != (long *)0x0) {
            (**(code **)(*local_70 + 0x10))(local_70);
          }
          if (local_70 == (long *)0x0) {
            if (node->ptr == (Node *)0x0) {
              local_60 = (long *)0x0;
            }
            else {
              local_60 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&SubdivMeshNode::typeinfo)
              ;
            }
            if (local_60 != (long *)0x0) {
              (**(code **)(*local_60 + 0x10))();
            }
            if (local_60 == (long *)0x0) {
              if (node->ptr == (Node *)0x0) {
                local_58 = (long *)0x0;
              }
              else {
                local_58 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&HairSetNode::typeinfo,0
                                                 );
              }
              if (local_58 != (long *)0x0) {
                (**(code **)(*local_58 + 0x10))(local_58);
              }
              if (local_58 == (long *)0x0) {
                if (node->ptr == (Node *)0x0) {
                  plVar7 = (long *)0x0;
                  local_50 = node;
                }
                else {
                  local_50 = node;
                  plVar7 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&PointSetNode::typeinfo,
                                                  0);
                }
                if ((plVar7 == (long *)0x0) ||
                   ((**(code **)(*plVar7 + 0x10))(plVar7),
                   (ulong)(plVar7[0x10] - plVar7[0xf]) < 0x21 == mblur)) {
                  if (plVar7 != (long *)0x0) {
                    (**(code **)(*plVar7 + 0x18))(plVar7);
                  }
                  goto LAB_0018cd33;
                }
                *(undefined8 *)this = 0;
                (**(code **)(*plVar7 + 0x18))(plVar7);
              }
              else {
                local_50 = node;
                if ((ulong)(local_58[0x10] - local_58[0xf]) < 0x21 == mblur) {
LAB_0018cd33:
                  node = local_50;
                  if (local_58 != (long *)0x0) {
                    (**(code **)(*local_58 + 0x18))(local_58);
                  }
                  goto LAB_0018cd50;
                }
                *(undefined8 *)this = 0;
              }
              node = local_50;
              if (local_58 != (long *)0x0) {
                (**(code **)(*local_58 + 0x18))(local_58);
              }
            }
            else {
              if ((ulong)(local_60[0xf] - local_60[0xe]) < 0x21 == mblur) {
LAB_0018cd50:
                if (local_60 != (long *)0x0) {
                  (**(code **)(*local_60 + 0x18))();
                }
                goto LAB_0018cd65;
              }
              *(undefined8 *)this = 0;
            }
            if (local_60 != (long *)0x0) {
              (**(code **)(*local_60 + 0x18))();
            }
          }
          else {
            if ((ulong)(local_70[0xf] - local_70[0xe]) < 0x21 == mblur) {
LAB_0018cd65:
              pNVar6 = local_68;
              if (local_70 != (long *)0x0) {
                (**(code **)(*local_70 + 0x18))(local_70);
              }
              goto LAB_0018cd78;
            }
            *(undefined8 *)this = 0;
          }
          if (local_70 != (long *)0x0) {
            (**(code **)(*local_70 + 0x18))(local_70);
          }
        }
        else {
          (*(pNVar6->super_RefCount)._vptr_RefCount[2])(pNVar6);
          if ((long)pNVar6[1].fileName._M_dataplus._M_p -
              pNVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i < 0x21 ==
              mblur) {
LAB_0018cd78:
            local_68 = (Node *)this;
            local_50 = node;
            if (pNVar6 != (Node *)0x0) {
              (*(pNVar6->super_RefCount)._vptr_RefCount[3])(pNVar6);
            }
            goto LAB_0018cd94;
          }
          *(undefined8 *)this = 0;
          plVar3 = local_78;
        }
        if (local_68 != (Node *)0x0) {
          (*(local_68->super_RefCount)._vptr_RefCount[3])();
        }
LAB_0018c968:
        if (plVar3 != (long *)0x0) {
          (**(code **)(*plVar3 + 0x18))(plVar3);
        }
        goto LAB_0018c976;
      }
      (**(code **)(*plVar4 + 0x10))(plVar4);
      lVar5 = plVar4[0xd];
      local_50 = node;
      if (plVar4[0xe] != lVar5) {
        uVar9 = 0;
        do {
          local_48.ptr = *(Node **)(lVar5 + uVar9 * 8);
          if (local_48.ptr != (Node *)0x0) {
            (*((local_48.ptr)->super_RefCount)._vptr_RefCount[2])();
          }
          remove_mblur((SceneGraph *)&local_80,&local_48,mblur);
          lVar5 = plVar4[0xd];
          plVar3 = *(long **)(lVar5 + uVar9 * 8);
          if (plVar3 != (long *)0x0) {
            (**(code **)(*plVar3 + 0x18))();
          }
          *(long *)(lVar5 + uVar9 * 8) = local_80;
          local_80 = 0;
          if (local_48.ptr != (Node *)0x0) {
            (*((local_48.ptr)->super_RefCount)._vptr_RefCount[3])();
          }
          uVar9 = uVar9 + 1;
          lVar5 = plVar4[0xd];
        } while (uVar9 < (ulong)(plVar4[0xe] - lVar5 >> 3));
      }
LAB_0018cd94:
      node = local_50;
      this = (SceneGraph *)local_68;
      plVar3 = local_78;
      if (plVar4 != (long *)0x0) {
        (**(code **)(*plVar4 + 0x18))(plVar4);
      }
    }
    else {
      (**(code **)(*plVar3 + 0x10))(plVar3);
      lVar5 = plVar3[0xd];
      if (mblur) {
        pSVar8 = this;
        if ((plVar3[0xe] == lVar5) || (1 < *(ulong *)(lVar5 + 0x10))) {
LAB_0018c961:
          *(Node **)pSVar8 = (Node *)0x0;
          goto LAB_0018c968;
        }
      }
      else if ((plVar3[0xe] != lVar5) && (1 < *(ulong *)(lVar5 + 0x10))) {
        *(Node **)this = node->ptr;
        pSVar8 = (SceneGraph *)node;
        goto LAB_0018c961;
      }
      local_40.ptr = (Node *)plVar3[0x10];
      if (local_40.ptr != (Node *)0x0) {
        (*((local_40.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      remove_mblur((SceneGraph *)&local_80,&local_40,mblur);
      if ((long *)plVar3[0x10] != (long *)0x0) {
        (**(code **)(*(long *)plVar3[0x10] + 0x18))();
      }
      plVar3[0x10] = local_80;
      local_80 = 0;
      if (local_40.ptr != (Node *)0x0) {
        (*((local_40.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
    }
    bVar1 = true;
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 0x18))(plVar3);
    }
    goto LAB_0018cdc7;
  }
  (**(code **)(*plVar2 + 0x10))(plVar2);
  if (mblur) {
    if ((ulong)plVar2[0xf] < 2) {
LAB_0018c882:
      local_38.ptr = (Node *)plVar2[0x13];
      if (local_38.ptr != (Node *)0x0) {
        (*((local_38.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      remove_mblur((SceneGraph *)&local_80,&local_38,mblur);
      if ((long *)plVar2[0x13] != (long *)0x0) {
        (**(code **)(*(long *)plVar2[0x13] + 0x18))();
      }
      plVar2[0x13] = local_80;
      local_80 = 0;
      if (local_38.ptr != (Node *)0x0) {
        (*((local_38.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      bVar1 = true;
      goto LAB_0018cdc7;
    }
    *(undefined8 *)this = 0;
  }
  else {
    if ((ulong)plVar2[0xf] < 2) goto LAB_0018c882;
    *(Node **)this = node->ptr;
    node->ptr = (Node *)0x0;
  }
LAB_0018c976:
  bVar1 = false;
LAB_0018cdc7:
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 0x18))(plVar2);
  }
  if (bVar1) {
    (((Node *)this)->super_RefCount)._vptr_RefCount = (_func_int **)node->ptr;
    node->ptr = (Node *)0x0;
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::remove_mblur(Ref<SceneGraph::Node> node, bool mblur)
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      if (mblur) {
        if (xfmNode->spaces.size() > 1)
          return nullptr;
      } else {
        if (xfmNode->spaces.size() > 1)
          return node;
      }
      xfmNode->child = remove_mblur(xfmNode->child, mblur);
    }
    else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
      if (mblur) {
        if (xfmNode->spaces.size() == 0 || xfmNode->spaces[0].size() > 1)
          return nullptr;
      } else {
        if (xfmNode->spaces.size() > 0 && xfmNode->spaces[0].size() > 1)
          return node;
      }
      xfmNode->child = remove_mblur(xfmNode->child, mblur);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>())
    {
      for (size_t i=0; i<groupNode->children.size(); i++)
        groupNode->children[i] = remove_mblur(groupNode->children[i], mblur);
    }
    else if (Ref<SceneGraph::TriangleMeshNode> mesh = node.dynamicCast<SceneGraph::TriangleMeshNode>())
    {
      if ((mesh->numTimeSteps() > 1) == mblur)
        return nullptr;
    }
    else if (Ref<SceneGraph::QuadMeshNode> mesh = node.dynamicCast<SceneGraph::QuadMeshNode>())
    {
      if ((mesh->numTimeSteps() > 1) == mblur)
        return nullptr;
    }
    else if (Ref<SceneGraph::SubdivMeshNode> mesh = node.dynamicCast<SceneGraph::SubdivMeshNode>())
    {
      if ((mesh->numTimeSteps() > 1) == mblur)
        return nullptr;
    }
    else if (Ref<SceneGraph::HairSetNode> mesh = node.dynamicCast<SceneGraph::HairSetNode>())
    {
      if ((mesh->numTimeSteps() > 1) == mblur)
        return nullptr;
    }
    else if (Ref<SceneGraph::PointSetNode> mesh = node.dynamicCast<SceneGraph::PointSetNode>())
    {
      if ((mesh->numTimeSteps() > 1) == mblur)
        return nullptr;
    }
    return node;
  }